

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  basic_format_specs<char> *pbVar4;
  undefined1 auVar5 [16];
  unsigned___int128 uVar6;
  char cVar7;
  uint uVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  int iVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  size_type sVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_00198984;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_00198984;
  }
  puVar1 = &this->abs_value;
  uVar6 = *puVar1;
  uVar19 = *(ulong *)((long)&this->abs_value + 8);
  auVar5 = (undefined1  [16])*puVar1;
  auVar22 = (undefined1  [16])*puVar1;
  uVar12 = 1;
  if (((ulong)uVar6 < 10) <= uVar19) {
    uVar12 = 4;
    auVar21 = auVar22;
    do {
      uVar16 = auVar21._8_8_;
      uVar18 = auVar21._0_8_;
      iVar10 = (int)uVar12;
      if (uVar16 == 0 && (ulong)(99 < uVar18) <= -uVar16) {
        uVar12 = (ulong)(iVar10 - 2);
        goto LAB_00198710;
      }
      if (uVar16 == 0 && (ulong)(999 < uVar18) <= -uVar16) {
        uVar12 = (ulong)(iVar10 - 1);
        goto LAB_00198710;
      }
      if (uVar16 < (uVar18 < 10000)) goto LAB_00198710;
      auVar21 = __udivti3(uVar18,uVar16,10000,0);
      uVar12 = (ulong)(iVar10 + 4);
    } while (uVar16 != 0 || -uVar16 < (ulong)(99999 < uVar18));
    uVar12 = (ulong)(iVar10 + 1);
  }
LAB_00198710:
  iVar10 = (int)uVar12;
  _Var11._M_p = local_298._M_dataplus._M_p;
  uVar16 = uVar12;
  uVar18 = uVar12;
  if (local_298._M_string_length == 0) {
LAB_00198757:
    iVar14 = (int)uVar18;
    uVar8 = (uint)uVar16;
    if (_Var11._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_00198762;
  }
  else {
    iVar14 = (int)local_298._M_string_length + iVar10;
    sVar15 = local_298._M_string_length;
    do {
      cVar3 = *_Var11._M_p;
      uVar8 = (int)uVar16 - (int)cVar3;
      if ((uVar8 == 0 || (int)uVar16 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_00198757;
      uVar18 = (ulong)((int)uVar18 + 1);
      _Var11._M_p = _Var11._M_p + 1;
      uVar16 = (ulong)uVar8;
      sVar15 = sVar15 - 1;
    } while (sVar15 != 0);
LAB_00198762:
    iVar14 = (int)(uVar8 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             iVar14;
  }
  pcVar13 = local_278 + iVar10;
  pcVar17 = pcVar13;
  if (((ulong)uVar6 < 100) <= uVar19) {
    do {
      lVar20 = auVar22._8_8_;
      uVar19 = auVar22._0_8_;
      pcVar13 = pcVar17 + -2;
      auVar22 = __udivti3(uVar19,lVar20,100,0);
      *(undefined2 *)(pcVar17 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar19 + auVar22._0_8_ * -100) * 2);
      pcVar17 = pcVar13;
      auVar5 = auVar22;
    } while (lVar20 != 0 || (ulong)-lVar20 < (ulong)(9999 < uVar19));
  }
  if (auVar5._8_8_ == 0 && (ulong)(9 < auVar5._0_8_) <= (ulong)-auVar5._8_8_) {
    pcVar13[-1] = auVar5[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar13 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar5._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0032bde0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar8 = iVar14 + this->prefix_size;
  uVar19 = (ulong)uVar8;
  if (500 < uVar8) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar19);
  }
  pcVar13 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar19 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar19;
  }
  pcVar17 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar8 + -1;
  if (1 < iVar10) {
    uVar12 = uVar12 + 1;
    iVar10 = 0;
    _Var11._M_p = local_298._M_dataplus._M_p;
    do {
      pcVar2 = pcVar17 + -1;
      *pcVar17 = local_278[uVar12 - 2];
      cVar3 = *_Var11._M_p;
      if ('\0' < cVar3) {
        iVar10 = iVar10 + 1;
        if ((cVar3 != '\x7f') && (iVar10 % (int)cVar3 == 0)) {
          if (_Var11._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
            iVar10 = 0;
            _Var11._M_p = _Var11._M_p + 1;
          }
          pcVar17[-1] = cVar7;
          pcVar2 = pcVar17 + -2;
        }
      }
      pcVar17 = pcVar2;
      uVar12 = uVar12 - 1;
    } while (2 < uVar12);
  }
  *pcVar17 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar17[-1] = 0x2d;
  }
  pbVar4 = this->specs;
  uVar12 = 0;
  if (uVar19 <= (uint)pbVar4->width) {
    uVar12 = (uint)pbVar4->width - uVar19;
  }
  uVar19 = uVar12 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
  bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    ((this->out).container,uVar19,&pbVar4->fill);
  bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                    (pcVar13,pcVar13 + (int)uVar8,bVar9);
  bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar9,uVar12 - uVar19,&pbVar4->fill);
  (this->out).container = bVar9.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_);
  }
LAB_00198984:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }